

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::AppendParams
          (iuCsvFileParamsGenerator<int> *this,params_t *params,string *data)

{
  bool bVar1;
  int local_24;
  string *psStack_20;
  int param;
  string *data_local;
  params_t *params_local;
  iuCsvFileParamsGenerator<int> *this_local;
  
  psStack_20 = data;
  data_local = (string *)params;
  params_local = (params_t *)this;
  bVar1 = StringIsBlank(data);
  if ((!bVar1) && (bVar1 = StringToValue<int>(psStack_20,&local_24), bVar1)) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)data_local,&local_24);
  }
  return;
}

Assistant:

void AppendParams(params_t& params, const ::std::string& data)
    {
        if( StringIsBlank(data) )
        {
            return;
        }
        T param;
        if( !StringToValue(data, param) )
        {
            return;
        }
        params.push_back(param);
    }